

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::resolveProcessorInstance
          (QualifiedIdentifierResolver *this,CallOrCast *call,ProcessorBase *p)

{
  CommaSeparatedList *pCVar1;
  size_t sVar2;
  pool_ptr<soul::AST::Expression> local_8;
  
  pCVar1 = (call->super_CallOrCastBase).arguments.object;
  if (pCVar1 == (CommaSeparatedList *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (pCVar1->items).numActive;
  }
  if ((long)(p->super_ModuleBase).specialisationParams.
            super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(p->super_ModuleBase).specialisationParams.
            super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 == sVar2) {
    local_8.object = &((call->super_CallOrCastBase).arguments.object)->super_Expression;
    call = (CallOrCast *)
           getOrCreateImplicitProcessorInstance
                     (this,&(call->super_CallOrCastBase).super_Expression.super_Statement.
                            super_ASTObject.context,p,&local_8);
  }
  return (Expression *)call;
}

Assistant:

AST::Expression& resolveProcessorInstance (AST::CallOrCast& call, AST::ProcessorBase& p)
        {
            if (p.specialisationParams.size() == call.getNumArguments())
                return getOrCreateImplicitProcessorInstance (call.context, p, call.arguments);

            return call;
        }